

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O0

void __thiscall
duckdb::BitpackingCompressionState<duckdb::hugeint_t,_true,_duckdb::hugeint_t>::
FlushAndCreateSegmentIfFull
          (BitpackingCompressionState<duckdb::hugeint_t,_true,_duckdb::hugeint_t> *this,
          idx_t required_data_bytes,idx_t required_meta_bytes)

{
  bool bVar1;
  pointer pCVar2;
  idx_t in_RSI;
  __atomic_base<unsigned_long> *in_RDI;
  BitpackingCompressionState<duckdb::hugeint_t,_true,_duckdb::hugeint_t> *unaff_retaddr;
  idx_t row_start;
  BitpackingCompressionState<duckdb::hugeint_t,_true,_duckdb::hugeint_t> *in_stack_00000090;
  idx_t in_stack_00000098;
  BitpackingCompressionState<duckdb::hugeint_t,_true,_duckdb::hugeint_t> *in_stack_000000a0;
  unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>
  *in_stack_ffffffffffffffd0;
  
  bVar1 = CanStore(unaff_retaddr,(idx_t)in_RDI,in_RSI);
  if (!bVar1) {
    pCVar2 = unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>::
             operator->(in_stack_ffffffffffffffd0);
    unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>::operator->
              ((unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>
                *)(pCVar2->super_SegmentBase<duckdb::ColumnSegment>).start);
    ::std::__atomic_base::operator_cast_to_unsigned_long(in_RDI);
    FlushSegment(in_stack_00000090);
    CreateEmptySegment(in_stack_000000a0,in_stack_00000098);
  }
  return;
}

Assistant:

void FlushAndCreateSegmentIfFull(idx_t required_data_bytes, idx_t required_meta_bytes) {
		if (!CanStore(required_data_bytes, required_meta_bytes)) {
			idx_t row_start = current_segment->start + current_segment->count;
			FlushSegment();
			CreateEmptySegment(row_start);
		}
	}